

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t decoder_init(aom_codec_ctx_t *ctx)

{
  undefined8 *puVar1;
  void *pvVar2;
  size_t in_RDI;
  aom_codec_alg_priv_t *priv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(long *)(in_RDI + 0x30) == 0) {
    pvVar2 = aom_calloc(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (pvVar2 == (void *)0x0) {
      return AOM_CODEC_MEM_ERROR;
    }
    *(void **)(in_RDI + 0x30) = pvVar2;
    *(undefined8 *)(*(long *)(in_RDI + 0x30) + 8) = *(undefined8 *)(in_RDI + 0x20);
    *(undefined4 *)((long)pvVar2 + 0x1a4) = 0;
    *(undefined4 *)((long)pvVar2 + 0xdc) = 1;
    if (*(long *)(in_RDI + 0x28) != 0) {
      puVar1 = *(undefined8 **)(in_RDI + 0x28);
      *(undefined8 *)((long)pvVar2 + 0xd0) = *puVar1;
      *(undefined8 *)((long)pvVar2 + 0xd8) = puVar1[1];
      *(long *)(in_RDI + 0x28) = (long)pvVar2 + 0xd0;
    }
    *(undefined8 *)((long)pvVar2 + 0x6b00) = 0;
    *(undefined4 *)((long)pvVar2 + 0x1d4) = 1;
    *(undefined4 *)((long)pvVar2 + 0x1cc) = 0;
    *(undefined4 *)((long)pvVar2 + 0x1c4) = 0xffffffff;
    *(undefined4 *)((long)pvVar2 + 0x1c8) = 0xffffffff;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t decoder_init(aom_codec_ctx_t *ctx) {
  // This function only allocates space for the aom_codec_alg_priv_t
  // structure. More memory may be required at the time the stream
  // information becomes known.
  if (!ctx->priv) {
    aom_codec_alg_priv_t *const priv =
        (aom_codec_alg_priv_t *)aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;
    priv->flushed = 0;

    // TODO(tdaede): this should not be exposed to the API
    priv->cfg.allow_lowbitdepth = !FORCE_HIGHBITDEPTH_DECODING;
    if (ctx->config.dec) {
      priv->cfg = *ctx->config.dec;
      ctx->config.dec = &priv->cfg;
    }
    priv->num_grain_image_frame_buffers = 0;
    // Turn row_mt on by default.
    priv->row_mt = 1;

    // Turn on normal tile coding mode by default.
    // 0 is for normal tile coding mode, and 1 is for large scale tile coding
    // mode(refer to lightfield example).
    priv->tile_mode = 0;
    priv->decode_tile_row = -1;
    priv->decode_tile_col = -1;
  }

  return AOM_CODEC_OK;
}